

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_26382a::SymlinkCommand::execute
          (SymlinkCommand *this,BuildSystem *system,TaskInterface ti,QueueJobContext *context,
          ResultFn *resultFn)

{
  size_t sVar1;
  bool bVar2;
  byte bVar3;
  BuildSystemDelegate *pBVar4;
  BuildSystemImpl *this_00;
  size_t sVar5;
  Style style;
  void *pvVar6;
  void *pvVar7;
  size_type sVar8;
  void *extraout_RDX;
  ArrayRef<llbuild::basic::FileInfo> outputInfos;
  StringRef path;
  TaskInterface ti_00;
  ArrayRef<llbuild::basic::FileInfo> local_368;
  BuildValue local_358;
  string local_2e8;
  undefined1 local_2c8 [8];
  FileInfo outputInfo;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined8 local_1a8;
  anon_unknown_dwarf_26382a *local_198;
  void *local_190;
  string local_188;
  string local_168;
  string local_148;
  byte local_121;
  undefined1 local_120 [7];
  bool success;
  path *local_100;
  char *local_f8;
  undefined1 local_f0 [8];
  StringRef parent;
  FileSystem *fs;
  undefined1 local_68 [8];
  StringRef outputPath;
  ResultFn *resultFn_local;
  QueueJobContext *context_local;
  BuildSystem *system_local;
  SymlinkCommand *this_local;
  TaskInterface ti_local;
  
  pvVar6 = ti.ctx;
  pvVar7 = pvVar6;
  outputPath.Length = (size_t)resultFn;
  _local_68 = getActualOutputPath(this);
  style = (Style)pvVar7;
  bVar2 = std::
          vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
          ::empty(&(this->super_Command).outputs);
  if ((bVar2) || (outputPath.Data == (char *)0x0)) {
    llbuild::buildsystem::BuildValue::makeFailedCommand();
    std::function<void_(llbuild::buildsystem::BuildValue_&&)>::operator()
              (resultFn,(BuildValue *)&fs);
    llbuild::buildsystem::BuildValue::~BuildValue((BuildValue *)&fs);
  }
  else {
    parent.Length = (size_t)llbuild::buildsystem::BuildSystem::getFileSystem(system);
    local_100 = (path *)local_68;
    local_f8 = outputPath.Data;
    path.Length = 2;
    path.Data = outputPath.Data;
    _local_f0 = llvm::sys::path::parent_path((path *)local_68,path,style);
    sVar1 = parent.Length;
    if (parent.Data != (char *)0x0) {
      llvm::StringRef::operator_cast_to_string((string *)local_120,(StringRef *)local_f0);
      (**(code **)(*(long *)sVar1 + 0x18))(sVar1,local_120);
      std::__cxx11::string::~string((string *)local_120);
    }
    pBVar4 = llbuild::buildsystem::BuildSystem::getDelegate(system);
    (*pBVar4->_vptr_BuildSystemDelegate[10])(pBVar4,this);
    sVar1 = parent.Length;
    local_121 = 1;
    sVar5 = parent.Length;
    llvm::StringRef::str_abi_cxx11_(&local_148,(StringRef *)local_68);
    bVar3 = (**(code **)(*(long *)sVar1 + 0x48))(sVar1,&this->contents,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    sVar1 = parent.Length;
    if (((bVar3 ^ 0xff) & 1) != 0) {
      llvm::StringRef::str_abi_cxx11_(&local_168,(StringRef *)local_68);
      (**(code **)(*(long *)sVar1 + 0x28))(sVar1,&local_168);
      std::__cxx11::string::~string((string *)&local_168);
      sVar1 = parent.Length;
      sVar5 = parent.Length;
      llvm::StringRef::str_abi_cxx11_(&local_188,(StringRef *)local_68);
      bVar3 = (**(code **)(*(long *)sVar1 + 0x48))(sVar1,&this->contents,&local_188);
      std::__cxx11::string::~string((string *)&local_188);
      if (((bVar3 ^ 0xff) & 1) != 0) {
        ti_00.ctx = extraout_RDX;
        ti_00.impl = pvVar6;
        local_198 = (anon_unknown_dwarf_26382a *)ti.impl;
        local_190 = pvVar6;
        this_00 = getBuildSystem((anon_unknown_dwarf_26382a *)ti.impl,ti_00);
        pBVar4 = BuildSystemImpl::getDelegate(this_00);
        llvm::StringRef::str_abi_cxx11_(&local_208,(StringRef *)local_68);
        std::operator+(&local_1e8,"unable to create symlink at \'",&local_208);
        std::operator+(&local_1c8,&local_1e8,"\'");
        local_1a8 = std::__cxx11::string::data();
        sVar5 = std::__cxx11::string::length();
        (*pBVar4->_vptr_BuildSystemDelegate[0xb])(pBVar4,this,local_1a8,sVar5);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::string::~string((string *)&local_208);
        local_121 = 0;
      }
    }
    pBVar4 = llbuild::buildsystem::BuildSystem::getDelegate(system);
    sVar8 = CONCAT71((int7)(sVar5 >> 8),local_121);
    (*pBVar4->_vptr_BuildSystemDelegate[0xe])(pBVar4,this,(ulong)((local_121 & 1) == 0));
    sVar1 = parent.Length;
    if ((local_121 & 1) == 0) {
      llbuild::buildsystem::BuildValue::makeFailedCommand();
      std::function<void_(llbuild::buildsystem::BuildValue_&&)>::operator()
                (resultFn,(BuildValue *)(outputInfo.checksum.bytes + 0x18));
      llbuild::buildsystem::BuildValue::~BuildValue
                ((BuildValue *)(outputInfo.checksum.bytes + 0x18));
    }
    else {
      llvm::StringRef::operator_cast_to_string(&local_2e8,(StringRef *)local_68);
      (**(code **)(*(long *)sVar1 + 0x40))(local_2c8,sVar1,&local_2e8);
      std::__cxx11::string::~string((string *)&local_2e8);
      llvm::ArrayRef<llbuild::basic::FileInfo>::ArrayRef(&local_368,(FileInfo *)local_2c8);
      outputInfos.Length = sVar8;
      outputInfos.Data = (FileInfo *)local_368.Length;
      llbuild::buildsystem::BuildValue::makeSuccessfulCommand
                (&local_358,(BuildValue *)local_368.Data,outputInfos);
      std::function<void_(llbuild::buildsystem::BuildValue_&&)>::operator()(resultFn,&local_358);
      llbuild::buildsystem::BuildValue::~BuildValue(&local_358);
    }
  }
  return;
}

Assistant:

virtual void execute(BuildSystem& system,
                       TaskInterface ti,
                       QueueJobContext* context,
                       ResultFn resultFn) override {
    // It is an error if this command isn't configured properly.
    StringRef outputPath = getActualOutputPath();
    if (outputs.empty() || outputPath.empty()) {
      resultFn(BuildValue::makeFailedCommand());
      return;
    }

    auto& fs = system.getFileSystem();

    // Create the directory containing the symlink, if necessary.
    //
    // FIXME: Shared behavior with ExternalCommand.
    {
      auto parent = llvm::sys::path::parent_path(outputPath);
      if (!parent.empty()) {
        (void) fs.createDirectories(parent);
      }
    }

    // Create the symbolic link (note that despite the poorly chosen LLVM
    // name, this is a symlink).
    system.getDelegate().commandStarted(this);
    auto success = true;
    if (!fs.createSymlink(contents, outputPath.str())) {
      // On failure, we attempt to unlink the file and retry.
      fs.remove(outputPath.str());

      if (!fs.createSymlink(contents, outputPath.str())) {
        getBuildSystem(ti).getDelegate().commandHadError(this,
                       "unable to create symlink at '" + outputPath.str() + "'");
        success = false;
      }
    }
    system.getDelegate().commandFinished(this, success ? ProcessStatus::Succeeded : ProcessStatus::Failed);
    
    // Process the result.
    if (!success) {
      resultFn(BuildValue::makeFailedCommand());
      return;
    }

    // Capture the *link* information of the output.
    FileInfo outputInfo = fs.getLinkInfo(outputPath);
      
    // Complete with a successful result.
    resultFn(BuildValue::makeSuccessfulCommand(outputInfo));
  }